

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

uint llvm::APInt::tcLSB(WordType *parts,uint n)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  
  if (n != 0) {
    lVar3 = 0;
    iVar2 = 0;
    do {
      uVar1 = parts[lVar3];
      if (uVar1 != 0) {
        lVar3 = 0;
        if (uVar1 != 0) {
          for (; (uVar1 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        return (int)lVar3 - iVar2;
      }
      iVar2 = iVar2 + -0x40;
      lVar3 = lVar3 + 1;
    } while (n != (uint)lVar3);
  }
  return 0xffffffff;
}

Assistant:

unsigned APInt::tcLSB(const WordType *parts, unsigned n) {
  for (unsigned i = 0; i < n; i++) {
    if (parts[i] != 0) {
      unsigned lsb = partLSB(parts[i]);

      return lsb + i * APINT_BITS_PER_WORD;
    }
  }

  return -1U;
}